

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Function
               (DataParser *parser,Instruction function_type,String *func_name,
               bool first_argument_piped)

{
  code *pcVar1;
  DataParser *this;
  bool bVar2;
  char cVar3;
  allocator<char> local_51;
  String local_50;
  byte local_29;
  uint local_28;
  bool looping;
  int num_arguments;
  bool first_argument_piped_local;
  String *func_name_local;
  DataParser *pDStack_10;
  Instruction function_type_local;
  DataParser *parser_local;
  
  looping = first_argument_piped;
  _num_arguments = func_name;
  func_name_local._4_4_ = function_type;
  pDStack_10 = parser;
  if (((function_type != TransformFnc) && (function_type != EventFnc)) &&
     (bVar2 = Assert("RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0x363), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_28 = (uint)((looping & 1U) != 0);
  cVar3 = DataParser::Look(pDStack_10);
  if (cVar3 == '(') {
    local_29 = 1;
    DataParser::Match(pDStack_10,'(',true);
    cVar3 = DataParser::Look(pDStack_10);
    if (cVar3 == ')') {
      DataParser::Match(pDStack_10,')',true);
      local_29 = 0;
    }
    while ((local_29 & 1) != 0) {
      local_28 = local_28 + 1;
      Expression(pDStack_10);
      DataParser::Push(pDStack_10);
      cVar3 = DataParser::Look(pDStack_10);
      this = pDStack_10;
      if (cVar3 == ')') {
        DataParser::Match(pDStack_10,')',true);
        local_29 = 0;
      }
      else if (cVar3 == ',') {
        DataParser::Match(pDStack_10,',',true);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"one of \')\' or \',\'",&local_51);
        DataParser::Expected(this,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::allocator<char>::~allocator(&local_51);
        local_29 = 0;
      }
    }
  }
  else {
    DataParser::SkipWhitespace(pDStack_10);
  }
  DataParser::Function(pDStack_10,func_name_local._4_4_,local_28,_num_arguments);
  return;
}

Assistant:

static void Function(DataParser& parser, Instruction function_type, String&& func_name, bool first_argument_piped)
	{
		RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc);

		// We already matched the variable name, and also pushed the first argument to the stack if it was piped using '|'.
		int num_arguments = first_argument_piped ? 1 : 0;
		if (parser.Look() == '(')
		{
			bool looping = true;

			parser.Match('(');
			if (parser.Look() == ')')
			{
				parser.Match(')');
				looping = false;
			}

			while (looping)
			{
				num_arguments += 1;
				Expression(parser);
				parser.Push();

				switch (parser.Look())
				{
				case ')':
					parser.Match(')');
					looping = false;
					break;
				case ',': parser.Match(','); break;
				default:
					parser.Expected("one of ')' or ','");
					looping = false;
					break;
				}
			}
		}
		else
		{
			parser.SkipWhitespace();
		}

		parser.Function(function_type, num_arguments, std::move(func_name));
	}